

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::AdvancedBindingUpdate::Cleanup(AdvancedBindingUpdate *this)

{
  AdvancedBindingUpdate *this_local;
  
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,this->m_vao);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,this->m_vbo);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,this->m_ebo);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vsp);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_fsp);
  glu::CallLogWrapper::glDeleteProgramPipelines
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_ppo);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDeleteVertexArrays(2, m_vao);
		glDeleteBuffers(2, m_vbo);
		glDeleteBuffers(2, m_ebo);
		glDeleteProgram(m_vsp);
		glDeleteProgram(m_fsp);
		glDeleteProgramPipelines(1, &m_ppo);
		return NO_ERROR;
	}